

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_csr.hpp
# Opt level: O2

void run<unsigned_int,double,boost::container::flat_map<unsigned_int,double,std::less<unsigned_int>,void>>
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *A_rows,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *A_cols,
               vector<double,_std::allocator<double>_> *A_values,
               vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
               *B)

{
  uint uVar1;
  size_type sVar2;
  uint uVar3;
  mapped_type *pmVar4;
  ulong uVar5;
  size_type sVar6;
  key_type local_54;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_50;
  size_type local_48;
  size_type local_40;
  mapped_type local_38;
  
  local_48 = ((long)(A_rows->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(A_rows->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 2) - 1;
  std::
  vector<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
  ::resize(B,local_48);
  sVar2 = 0;
  uVar3 = *(A_rows->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_50 = A_rows;
  while (sVar6 = sVar2, sVar6 != local_48) {
    local_40 = sVar6 + 1;
    uVar1 = (local_50->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start[sVar6 + 1];
    for (uVar5 = (ulong)uVar3; sVar2 = local_40, uVar3 = uVar1, uVar5 < uVar1; uVar5 = uVar5 + 1) {
      local_38 = (A_values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar5];
      local_54 = (key_type)sVar6;
      pmVar4 = boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>::
               priv_subscript((B->
                              super__Vector_base<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>,_std::allocator<boost::container::flat_map<unsigned_int,_double,_std::less<unsigned_int>,_void>_>_>
                              )._M_impl.super__Vector_impl_data._M_start +
                              (A_cols->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start[uVar5],&local_54);
      *pmVar4 = local_38;
    }
  }
  do_nothing(B);
  return;
}

Assistant:

void run(std::vector<IndexT> const & A_rows, std::vector<IndexT> const & A_cols, std::vector<NumericT> const & A_values,
         std::vector<RowT> & B)
{
  std::size_t N = A_rows.size() - 1;
  B.resize(N);

  IndexT row_start = A_rows[0];
  for (std::size_t row = 0; row < N; ++row)
  {
    IndexT row_stop  = A_rows[row+1];

    for (IndexT nnz_index = row_start; nnz_index < row_stop; ++nnz_index)
      B[A_cols[nnz_index]][row] = A_values[nnz_index];

    row_start = row_stop;
  }

  do_nothing(B);
}